

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minireflect.h
# Opt level: O3

void __thiscall
flatbuffers::ToStringVisitor::Named<unsigned_int>(ToStringVisitor *this,uint x,char *name)

{
  string local_38;
  
  if (name == (char *)0x0) {
    NumToString<unsigned_int>(&local_38,x);
    std::__cxx11::string::_M_append((char *)&this->s,(ulong)local_38._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if (this->q == true) {
      std::__cxx11::string::append((char *)&this->s);
    }
    std::__cxx11::string::append((char *)&this->s);
    if (this->q == true) {
      std::__cxx11::string::append((char *)&this->s);
      return;
    }
  }
  return;
}

Assistant:

void Named(T x, const char *name) {
    if (name) {
      if (q) s += "\"";
      s += name;
      if (q) s += "\"";
    } else {
      s += NumToString(x);
    }
  }